

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

Maybe<kj::StringPtr_&> __thiscall
kj::Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::BadHasher>>::
find<0ul,char_const(&)[7]>
          (Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::BadHasher>> *this,
          char (*params) [7])

{
  int iVar1;
  long lVar2;
  BadHasher *this_00;
  char *pcVar3;
  bool bVar4;
  size_t sVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  char *in_RDX;
  ulong uVar10;
  size_t in_R8;
  StringPtr a;
  StringPtr b;
  
  uVar6 = *(ulong *)(params + 8);
  if (uVar6 != 0) {
    lVar7 = *(long *)params;
    uVar8 = (ulong)((int)uVar6 - 1U & 0x4d2);
    while( true ) {
      uVar10 = uVar8 & 0xffffffff;
      lVar2 = *(long *)(params[6] + 6);
      iVar1 = *(int *)(lVar2 + 4 + uVar10 * 8);
      if (iVar1 == 0) break;
      if ((iVar1 != 1) && (*(int *)(lVar2 + uVar10 * 8) == 0x4d2)) {
        lVar9 = (ulong)(iVar1 - 2) * 0x10;
        this_00 = *(BadHasher **)(lVar7 + lVar9);
        pcVar3 = *(char **)(lVar7 + 8 + lVar9);
        sVar5 = strlen(in_RDX);
        a.content.size_ = (size_t)in_RDX;
        a.content.ptr = pcVar3;
        b.content.size_ = in_R8;
        b.content.ptr = (char *)(sVar5 + 1);
        bVar4 = _::anon_unknown_0::BadHasher::matches(this_00,a,b);
        if (bVar4) {
          lVar7 = (ulong)(*(int *)(lVar2 + 4 + uVar10 * 8) - 2) * 0x10 + *(long *)params;
          goto LAB_00150330;
        }
        uVar6 = *(ulong *)(params + 8);
      }
      uVar8 = 0;
      if (uVar10 + 1 != uVar6) {
        uVar8 = uVar10 + 1;
      }
    }
  }
  lVar7 = 0;
LAB_00150330:
  *(long *)this = lVar7;
  return (Maybe<kj::StringPtr_&>)(StringPtr *)this;
}

Assistant:

kj::Maybe<Row&> Table<Row, Indexes...>::find(Params&&... params) {
  KJ_IF_SOME(pos, get<index>(indexes).find(rows.asPtr(), kj::fwd<Params>(params)...)) {
    return rows[pos];
  } else {
    return kj::none;
  }
}